

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

text * lest::pluralise(text *__return_storage_ptr__,text *word,int n)

{
  string asStack_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (n == 1) {
    std::__cxx11::string::string(asStack_58,(string *)word);
  }
  else {
    std::operator+(&local_38,word,"s");
    std::__cxx11::string::string(asStack_58,(string *)&local_38);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,asStack_58);
  std::__cxx11::string::_M_dispose();
  if (n != 1) {
    std::__cxx11::string::_M_dispose();
  }
  return __return_storage_ptr__;
}

Assistant:

inline text pluralise( text word,int n )
{
    return n == 1 ? word : word + "s";
}